

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_option_z.c
# Opt level: O2

void test_option_z(void)

{
  wchar_t wVar1;
  wchar_t wVar2;
  char *__ptr;
  size_t s;
  
  assertion_make_file("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/tar/test/test_option_z.c"
                      ,L'\x11',"f",L'Ƥ',L'\xffffffff',"a");
  wVar1 = systemf("%s -zcf archive.out f 2>archive.err",testprog);
  __ptr = slurpfile(&s,"archive.err");
  __ptr[s] = '\0';
  if (wVar1 == L'\0') {
    free(__ptr);
    __ptr = slurpfile(&s,"archive.out");
    assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/tar/test/test_option_z.c"
                     ,L'#',(uint)(4 < s),"s > 4",(void *)0x0);
    assertion_equal_mem("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/tar/test/test_option_z.c"
                        ,L'$',__ptr,"p",anon_var_dwarf_1d05e,"\"\\x1f\\x8b\\x08\\x00\"",4,"4",
                        (void *)0x0);
  }
  else {
    wVar2 = canGzip();
    if (wVar2 == L'\0') {
      skipping_setup("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/tar/test/test_option_z.c"
                     ,L'\x19');
      test_skipping("gzip is not supported on this platform");
    }
    else {
      failure("-z option is broken");
      assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/tar/test/test_option_z.c"
                          ,L'\x1d',(long)wVar1,"r",0,"0",(void *)0x0);
    }
  }
  free(__ptr);
  return;
}

Assistant:

DEFINE_TEST(test_option_z)
{
	char *p;
	int r;
	size_t s;

	/* Create a file. */
	assertMakeFile("f", 0644, "a");

	/* Archive it with gzip compression. */
	r = systemf("%s -zcf archive.out f 2>archive.err", testprog);
	p = slurpfile(&s, "archive.err");
	p[s] = '\0';
	if (r != 0) {
		if (!canGzip()) {
			skipping("gzip is not supported on this platform");
			goto done;
		}
		failure("-z option is broken");
		assertEqualInt(r, 0);
		goto done;
	}
	free(p);
	/* Check that the archive file has a gzip signature. */
	p = slurpfile(&s, "archive.out");
	assert(s > 4);
	assertEqualMem(p, "\x1f\x8b\x08\x00", 4);
done:
	free(p);
}